

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformNamedArg(Transformer *this,PGNamedArgExpr *root)

{
  pointer pPVar1;
  long in_RDX;
  allocator local_39;
  string local_38 [32];
  
  TransformExpression(this,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
  if (*(long *)(in_RDX + 0x10) != 0) {
    pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)this);
    ::std::__cxx11::string::string(local_38,*(char **)(in_RDX + 0x10),&local_39);
    ::std::__cxx11::string::operator=((string *)&(pPVar1->super_BaseExpression).alias,local_38);
    ::std::__cxx11::string::~string(local_38);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformNamedArg(duckdb_libpgquery::PGNamedArgExpr &root) {

	auto expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(root.arg));
	if (root.name) {
		expr->SetAlias(root.name);
	}
	return expr;
}